

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdfdrivr.c
# Opt level: O0

FT_Error bdf_interpret_style(BDF_Face bdf)

{
  FT_Memory memory_00;
  bdf_font_t *font_00;
  char *__src;
  bdf_property_t *pbVar1;
  size_t sVar2;
  FT_String *pFVar3;
  bool bVar4;
  ulong local_b0;
  size_t mm;
  char *src;
  char *s;
  size_t lengths [4];
  size_t len;
  size_t nn;
  char *strings [4];
  bdf_property_t *prop;
  bdf_font_t *font;
  FT_Memory memory;
  FT_Face face;
  BDF_Face pBStack_18;
  FT_Error error;
  BDF_Face bdf_local;
  
  face._4_4_ = 0;
  memory_00 = (bdf->root).memory;
  font_00 = bdf->bdffont;
  pBStack_18 = bdf;
  memset(&nn,0,0x20);
  (bdf->root).style_flags = 0;
  pbVar1 = bdf_get_font_property(font_00,"SLANT");
  if ((((pbVar1 != (bdf_property_t *)0x0) && (pbVar1->format == 1)) &&
      ((pbVar1->value).atom != (char *)0x0)) &&
     (((*(pbVar1->value).atom == 'O' || (*(pbVar1->value).atom == 'o')) ||
      ((*(pbVar1->value).atom == 'I' || (*(pbVar1->value).atom == 'i')))))) {
    (bdf->root).style_flags = (bdf->root).style_flags | 1;
    bVar4 = true;
    if (*(pbVar1->value).atom != 'O') {
      bVar4 = *(pbVar1->value).atom == 'o';
    }
    strings[1] = "Italic";
    if (bVar4) {
      strings[1] = "Oblique";
    }
  }
  pbVar1 = bdf_get_font_property(font_00,"WEIGHT_NAME");
  if (((pbVar1 != (bdf_property_t *)0x0) && (pbVar1->format == 1)) &&
     (((pbVar1->value).atom != (char *)0x0 &&
      ((*(pbVar1->value).atom == 'B' || (*(pbVar1->value).atom == 'b')))))) {
    (bdf->root).style_flags = (bdf->root).style_flags | 2;
    strings[0] = "Bold";
  }
  pbVar1 = bdf_get_font_property(font_00,"SETWIDTH_NAME");
  if (((((pbVar1 != (bdf_property_t *)0x0) && (pbVar1->format == 1)) &&
       ((pbVar1->value).atom != (char *)0x0)) &&
      ((*(pbVar1->value).atom != '\0' && (*(pbVar1->value).atom != 'N')))) &&
     (*(pbVar1->value).atom != 'n')) {
    strings[2] = (pbVar1->value).atom;
  }
  pbVar1 = bdf_get_font_property(font_00,"ADD_STYLE_NAME");
  if (((pbVar1 != (bdf_property_t *)0x0) && (pbVar1->format == 1)) &&
     (((pbVar1->value).atom != (char *)0x0 &&
      (((*(pbVar1->value).atom != '\0' && (*(pbVar1->value).atom != 'N')) &&
       (*(pbVar1->value).atom != 'n')))))) {
    nn = (pbVar1->value).ul;
  }
  lengths[3] = 0;
  for (len = 0; len < 4; len = len + 1) {
    lengths[len - 1] = 0;
    if (strings[len - 1] != (char *)0x0) {
      sVar2 = strlen(strings[len - 1]);
      lengths[len - 1] = sVar2;
      lengths[3] = lengths[len - 1] + lengths[3] + 1;
    }
  }
  if (lengths[3] == 0) {
    nn = (size_t)anon_var_dwarf_1b9a34;
    sVar2 = strlen("Regular");
    lengths[3] = sVar2 + 1;
  }
  pFVar3 = (FT_String *)ft_mem_alloc(memory_00,lengths[3],(FT_Error *)((long)&face + 4));
  (bdf->root).style_name = pFVar3;
  if (face._4_4_ == 0) {
    src = (bdf->root).style_name;
    for (len = 0; len < 4; len = len + 1) {
      __src = strings[len - 1];
      lengths[3] = lengths[len - 1];
      if (__src != (char *)0x0) {
        if (src != (bdf->root).style_name) {
          *src = ' ';
          src = src + 1;
        }
        memcpy(src,__src,lengths[3]);
        if ((len == 0) || (len == 3)) {
          for (local_b0 = 0; local_b0 < lengths[3]; local_b0 = local_b0 + 1) {
            if (src[local_b0] == ' ') {
              src[local_b0] = '-';
            }
          }
        }
        src = src + lengths[3];
      }
    }
    *src = '\0';
    bdf_local._4_4_ = face._4_4_;
  }
  else {
    bdf_local._4_4_ = face._4_4_;
  }
  return bdf_local._4_4_;
}

Assistant:

static FT_Error
  bdf_interpret_style( BDF_Face  bdf )
  {
    FT_Error         error  = FT_Err_Ok;
    FT_Face          face   = FT_FACE( bdf );
    FT_Memory        memory = face->memory;
    bdf_font_t*      font   = bdf->bdffont;
    bdf_property_t*  prop;

    char*   strings[4] = { NULL, NULL, NULL, NULL };
    size_t  nn, len, lengths[4];


    face->style_flags = 0;

    prop = bdf_get_font_property( font, (char *)"SLANT" );
    if ( prop && prop->format == BDF_ATOM                             &&
         prop->value.atom                                             &&
         ( *(prop->value.atom) == 'O' || *(prop->value.atom) == 'o' ||
           *(prop->value.atom) == 'I' || *(prop->value.atom) == 'i' ) )
    {
      face->style_flags |= FT_STYLE_FLAG_ITALIC;
      strings[2] = ( *(prop->value.atom) == 'O' || *(prop->value.atom) == 'o' )
                   ? (char *)"Oblique"
                   : (char *)"Italic";
    }

    prop = bdf_get_font_property( font, (char *)"WEIGHT_NAME" );
    if ( prop && prop->format == BDF_ATOM                             &&
         prop->value.atom                                             &&
         ( *(prop->value.atom) == 'B' || *(prop->value.atom) == 'b' ) )
    {
      face->style_flags |= FT_STYLE_FLAG_BOLD;
      strings[1] = (char *)"Bold";
    }

    prop = bdf_get_font_property( font, (char *)"SETWIDTH_NAME" );
    if ( prop && prop->format == BDF_ATOM                              &&
         prop->value.atom && *(prop->value.atom)                       &&
         !( *(prop->value.atom) == 'N' || *(prop->value.atom) == 'n' ) )
      strings[3] = (char *)(prop->value.atom);

    prop = bdf_get_font_property( font, (char *)"ADD_STYLE_NAME" );
    if ( prop && prop->format == BDF_ATOM                              &&
         prop->value.atom && *(prop->value.atom)                       &&
         !( *(prop->value.atom) == 'N' || *(prop->value.atom) == 'n' ) )
      strings[0] = (char *)(prop->value.atom);

    for ( len = 0, nn = 0; nn < 4; nn++ )
    {
      lengths[nn] = 0;
      if ( strings[nn] )
      {
        lengths[nn] = ft_strlen( strings[nn] );
        len        += lengths[nn] + 1;
      }
    }

    if ( len == 0 )
    {
      strings[0] = (char *)"Regular";
      lengths[0] = ft_strlen( strings[0] );
      len        = lengths[0] + 1;
    }

    {
      char*  s;


      if ( FT_ALLOC( face->style_name, len ) )
        return error;

      s = face->style_name;

      for ( nn = 0; nn < 4; nn++ )
      {
        char*  src = strings[nn];


        len = lengths[nn];

        if ( !src )
          continue;

        /* separate elements with a space */
        if ( s != face->style_name )
          *s++ = ' ';

        ft_memcpy( s, src, len );

        /* need to convert spaces to dashes for */
        /* add_style_name and setwidth_name     */
        if ( nn == 0 || nn == 3 )
        {
          size_t  mm;


          for ( mm = 0; mm < len; mm++ )
            if ( s[mm] == ' ' )
              s[mm] = '-';
        }

        s += len;
      }
      *s = 0;
    }

    return error;
  }